

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O1

QString * makeString(QString *__return_storage_ptr__,QCborContainerPrivate *d,qsizetype idx,
                    ConversionMode mode)

{
  Element *pEVar1;
  Type t;
  Element *pEVar2;
  QCborContainerPrivate *pQVar3;
  QArrayData *pQVar4;
  QCborContainerPrivate *pQVar5;
  qsizetype qVar6;
  Int IVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QCborValue local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pEVar2 = (d->elements).d.ptr;
  pEVar1 = pEVar2 + idx;
  t = pEVar2[idx].type;
  if (t < False) {
    if (t < String) {
      if (t == Invalid) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return __return_storage_ptr__;
        }
        goto LAB_002f24fc;
      }
      if (t == Integer) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QString::number(__return_storage_ptr__,(pEVar1->field_0).value,10);
          return __return_storage_ptr__;
        }
        goto LAB_002f24fc;
      }
      if (t != ByteArray) goto LAB_002f23e4;
      if (mode != FromVariantToJson) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          encodeByteArray(__return_storage_ptr__,d,idx,0x15);
          return __return_storage_ptr__;
        }
        goto LAB_002f24fc;
      }
LAB_002f2347:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QCborContainerPrivate::stringAt(__return_storage_ptr__,d,idx);
        return __return_storage_ptr__;
      }
    }
    else {
      if (t < Map) {
        if (t == String) goto LAB_002f2347;
        if (t == Array) goto LAB_002f237c;
      }
      else {
        if (t == Map) {
LAB_002f237c:
          QCborContainerPrivate::valueAt(&local_38,d,idx);
          QCborValue::toDiagnosticNotation
                    (__return_storage_ptr__,(QCborValue *)&local_38,(DiagnosticNotationOptions)0x0);
          QCborValue::~QCborValue((QCborValue *)&local_38);
          goto LAB_002f243a;
        }
        if (t == Tag) goto LAB_002f21dd;
      }
LAB_002f23e4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        simpleTypeString(__return_storage_ptr__,t);
        return __return_storage_ptr__;
      }
    }
    goto LAB_002f24fc;
  }
  switch(t) {
  case False:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"false";
    (__return_storage_ptr__->d).size = 5;
    break;
  case True:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    pcVar8 = L"true";
    goto LAB_002f242e;
  case Null:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    pcVar8 = L"null";
LAB_002f242e:
    (__return_storage_ptr__->d).ptr = pcVar8;
    (__return_storage_ptr__->d).size = 4;
    break;
  case Undefined:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = L"undefined";
    (__return_storage_ptr__->d).size = 9;
    break;
  default:
    if ((0x25 < (uint)(t + 0xffff0000)) ||
       ((0x2900000001U >> ((ulong)(uint)(t + 0xffff0000) & 0x3f) & 1) == 0)) {
      if (t == Double) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QString::number(__return_storage_ptr__,(double)pEVar1->field_0,'g',6);
          return __return_storage_ptr__;
        }
        goto LAB_002f24fc;
      }
      goto LAB_002f23e4;
    }
LAB_002f21dd:
    IVar7 = (pEVar1->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
            super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    pQVar3 = (pEVar1->field_0).container;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    if ((pQVar3 != (QCborContainerPrivate *)0x0 && (IVar7 & 1) != 0) &&
       ((pQVar3->elements).d.size == 2)) {
      maybeEncodeTag((QString *)&local_38,pQVar3);
      pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pQVar5 = (QCborContainerPrivate *)(__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = (Data *)local_38.n;
      (__return_storage_ptr__->d).ptr = (char16_t *)local_38.container;
      qVar6 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_38._16_8_;
      local_38.n = (qint64)pQVar4;
      local_38.container = pQVar5;
      local_38._16_8_ = qVar6;
      if (pQVar4 != (QArrayData *)0x0) {
        LOCK();
        (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar4,2,0x10);
        }
      }
      if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
        makeString((QString *)&local_38,pQVar3,1,FromRaw);
        pQVar4 = &((__return_storage_ptr__->d).d)->super_QArrayData;
        pQVar3 = (QCborContainerPrivate *)(__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = (Data *)local_38.n;
        (__return_storage_ptr__->d).ptr = (char16_t *)local_38.container;
        qVar6 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_38._16_8_;
        local_38.n = (qint64)pQVar4;
        local_38.container = pQVar3;
        local_38._16_8_ = qVar6;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
      }
    }
  }
LAB_002f243a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
LAB_002f24fc:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE static QString makeString(const QCborContainerPrivate *d, qsizetype idx,
                                         ConversionMode mode)
{
    const auto &e = d->elements.at(idx);

    switch (e.type) {
    case QCborValue::Integer:
        return QString::number(qint64(e.value));

    case QCborValue::Double:
        return QString::number(e.fpvalue());

    case QCborValue::ByteArray:
        return mode == ConversionMode::FromVariantToJson
                ? d->stringAt(idx)
                : encodeByteArray(d, idx, QCborTag(QCborKnownTags::ExpectedBase64url));

    case QCborValue::String:
        return d->stringAt(idx);

    case QCborValue::Array:
    case QCborValue::Map:
#if defined(QT_BOOTSTRAPPED)
        Q_UNREACHABLE_RETURN(QString());
#else
        return d->valueAt(idx).toDiagnosticNotation(QCborValue::Compact);
#endif

    case QCborValue::SimpleType:
        break;

    case QCborValue::False:
        return QStringLiteral("false");

    case QCborValue::True:
        return QStringLiteral("true");

    case QCborValue::Null:
        return QStringLiteral("null");

    case QCborValue::Undefined:
        return QStringLiteral("undefined");

    case QCborValue::Invalid:
        return QString();

    case QCborValue::Tag:
    case QCborValue::DateTime:
    case QCborValue::Url:
    case QCborValue::RegularExpression:
    case QCborValue::Uuid:
        return encodeTag(e.flags & Element::IsContainer ? e.container : nullptr);
    }

    // maybe it's a simple type
    return simpleTypeString(e.type);
}